

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int main(void)

{
  int iVar1;
  
  _plan(0x1b,true);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  test_uints();
  test_ints();
  test_bools();
  test_floats();
  test_doubles();
  test_nils();
  test_strls();
  test_binls();
  test_extls();
  test_strs();
  test_bins();
  test_exts();
  test_arrays();
  test_maps();
  test_memcpy();
  test_next_on_arrays();
  test_next_on_maps();
  test_compare_uints();
  test_format();
  test_mp_print();
  test_mp_print_ext();
  test_mp_check();
  test_mp_check_exact();
  test_mp_check_ext_data();
  test_mp_check_error();
  test_mp_read_typed();
  test_overflow();
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int main()
{
	plan(27);
	header();

	test_uints();
	test_ints();
	test_bools();
	test_floats();
	test_doubles();
	test_nils();
	test_strls();
	test_binls();
	test_extls();
	test_strs();
	test_bins();
	test_exts();
	test_arrays();
	test_maps();
	test_memcpy();
	test_next_on_arrays();
	test_next_on_maps();
	test_compare_uints();
	test_format();
	test_mp_print();
	test_mp_print_ext();
	test_mp_check();
	test_mp_check_exact();
	test_mp_check_ext_data();
	test_mp_check_error();
	test_mp_read_typed();
	test_overflow();

	footer();
	return check_plan();
}